

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::BaseBuilder::align(BaseBuilder *this,uint32_t alignMode,uint32_t alignment)

{
  Error EVar1;
  AlignNode *in_RAX;
  AlignNode *node;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar1 = 5;
  }
  else {
    node = in_RAX;
    EVar1 = _newAlignNode(this,&node,alignMode,alignment);
    if (EVar1 == 0) {
      addNode(this,&node->super_BaseNode);
    }
  }
  return EVar1;
}

Assistant:

Error BaseBuilder::align(uint32_t alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  AlignNode* node;
  ASMJIT_PROPAGATE(_newAlignNode(&node, alignMode, alignment));

  addNode(node);
  return kErrorOk;
}